

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2NeverNewline(void)

{
  char *str;
  bool bVar1;
  long lVar2;
  StringPiece m;
  RE2 re;
  StringPiece *local_2c0;
  StringPiece local_2b8;
  Options local_2a8;
  undefined1 local_290 [384];
  RE2 local_110;
  
  local_2a8.encoding_ = EncodingUTF8;
  local_2a8.posix_syntax_ = false;
  local_2a8.longest_match_ = false;
  local_2a8.log_errors_ = true;
  local_2a8.max_mem_ = 0x800000;
  local_2a8.literal_ = false;
  local_2a8.never_nl_ = true;
  local_2a8.dot_nl_ = false;
  local_2a8.never_capture_ = false;
  local_2a8.case_sensitive_ = true;
  local_2a8.perl_classes_ = false;
  local_2a8.word_boundary_ = false;
  local_2a8.one_line_ = false;
  lVar2 = 0;
  do {
    if (lVar2 == 0x78) {
      return;
    }
    str = *(char **)((long)&DAT_0016c350 + lVar2);
    StringPiece::StringPiece((StringPiece *)local_290,*(char **)((long)&never_tests + lVar2));
    RE2::RE2(&local_110,(StringPiece *)local_290,&local_2a8);
    if (str == (char *)0x0) {
      StringPiece::StringPiece
                ((StringPiece *)local_290,
                 *(char **)((long)&PTR_anon_var_dwarf_16087_0016c348 + lVar2));
      bVar1 = RE2::PartialMatch<>((StringPiece *)local_290,&local_110);
      if (bVar1) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_290,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                   ,0x525);
        std::operator<<((ostream *)(local_290 + 8),"Check failed: !(re.PartialMatch(t.text, re))");
        goto LAB_0012cd91;
      }
    }
    else {
      local_2b8.ptr_ = (char *)0x0;
      local_2b8.length_ = 0;
      StringPiece::StringPiece
                ((StringPiece *)local_290,
                 *(char **)((long)&PTR_anon_var_dwarf_16087_0016c348 + lVar2));
      local_2c0 = &local_2b8;
      bVar1 = RE2::PartialMatch<re2::StringPiece*>((StringPiece *)local_290,&local_110,&local_2c0);
      if (!bVar1) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_290,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                   ,0x528);
        std::operator<<((ostream *)(local_290 + 8),"Check failed: re.PartialMatch(t.text, re, &m)");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
      }
      StringPiece::StringPiece((StringPiece *)local_290,str);
      bVar1 = StringPiece::_equal(&local_2b8,(StringPiece *)local_290);
      if (!bVar1) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_290,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                   ,0x529);
        std::operator<<((ostream *)(local_290 + 8),"Check failed: (m) == (t.match)");
LAB_0012cd91:
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
      }
    }
    RE2::~RE2(&local_110);
    lVar2 = lVar2 + 0x18;
  } while( true );
}

Assistant:

TEST(RE2, NeverNewline) {
  RE2::Options opt;
  opt.set_never_nl(true);
  for (int i = 0; i < arraysize(never_tests); i++) {
    const NeverTest& t = never_tests[i];
    RE2 re(t.regexp, opt);
    if (t.match == NULL) {
      EXPECT_FALSE(re.PartialMatch(t.text, re));
    } else {
      StringPiece m;
      EXPECT_TRUE(re.PartialMatch(t.text, re, &m));
      EXPECT_EQ(m, t.match);
    }
  }
}